

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# javanano_helpers.cc
# Opt level: O3

string * google::protobuf::compiler::javanano::ToJavaName
                   (string *__return_storage_ptr__,Params *params,string *name,bool is_class,
                   Descriptor *parent,FileDescriptor *file)

{
  const_iterator cVar1;
  undefined7 in_register_00000009;
  FileDescriptor *descriptor;
  string local_48;
  
  descriptor = (FileDescriptor *)CONCAT71(in_register_00000009,is_class);
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  if (parent != (Descriptor *)0x0) {
    ToJavaName(&local_48,params,*(string **)parent,true,*(Descriptor **)(parent + 0x18),
               *(FileDescriptor **)(parent + 0x10));
    std::__cxx11::string::_M_append((char *)__return_storage_ptr__,(ulong)local_48._M_dataplus._M_p)
    ;
    goto LAB_0021b6f9;
  }
  if ((is_class) && (params->override_java_multiple_files_ != JAVANANO_MUL_FALSE)) {
    if (params->override_java_multiple_files_ != JAVANANO_MUL_TRUE) {
      cVar1 = std::
              _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::find(&(params->java_multiple_files_)._M_t,*(key_type **)file);
      descriptor = (FileDescriptor *)
                   &(params->java_multiple_files_)._M_t._M_impl.super__Rb_tree_header;
      if (cVar1._M_node == (_Base_ptr)descriptor) goto LAB_0021b6da;
    }
    FileJavaPackage_abi_cxx11_(&local_48,(javanano *)params,(Params *)file,descriptor);
    std::__cxx11::string::_M_append((char *)__return_storage_ptr__,(ulong)local_48._M_dataplus._M_p)
    ;
  }
  else {
LAB_0021b6da:
    ClassName_abi_cxx11_(&local_48,(javanano *)params,(Params *)file,descriptor);
    std::__cxx11::string::_M_append((char *)__return_storage_ptr__,(ulong)local_48._M_dataplus._M_p)
    ;
  }
LAB_0021b6f9:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_dataplus._M_p != &local_48.field_2) {
    operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
  }
  if (__return_storage_ptr__->_M_string_length != 0) {
    std::__cxx11::string::_M_replace_aux
              ((ulong)__return_storage_ptr__,__return_storage_ptr__->_M_string_length,0,'\x01');
  }
  RenameKeywords::RenameJavaKeywordsImpl(&local_48,(RenameKeywords *)sRenameKeywords,name);
  std::__cxx11::string::_M_append((char *)__return_storage_ptr__,(ulong)local_48._M_dataplus._M_p);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_dataplus._M_p != &local_48.field_2) {
    operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

string ToJavaName(const Params& params, const string& name, bool is_class,
    const Descriptor* parent, const FileDescriptor* file) {
  string result;
  if (parent != NULL) {
    result.append(ClassName(params, parent));
  } else if (is_class && params.java_multiple_files(file->name())) {
    result.append(FileJavaPackage(params, file));
  } else {
    result.append(ClassName(params, file));
  }
  if (!result.empty()) result.append(1, '.');
  result.append(RenameJavaKeywords(name));
  return result;
}